

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signature.cc
# Opt level: O2

string * __thiscall flow::Signature::to_s_abi_cxx11_(string *__return_storage_ptr__,Signature *this)

{
  LiteralType *pLVar1;
  LiteralType *pLVar2;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  pLVar1 = (this->args_).super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pLVar2 = (this->args_).
                super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>._M_impl.
                super__Vector_impl_data._M_start; pLVar2 != pLVar1; pLVar2 = pLVar2 + 1) {
    signatureType(*pLVar2);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  signatureType(this->returnType_);
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string Signature::to_s() const {
  std::string result = name_;
  result += "(";
  for (LiteralType t : args_) result += signatureType(t);
  result += ")";
  result += signatureType(returnType_);
  return result;
}